

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

bool FBehavior::StaticCheckAllGood(void)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    uVar4 = (ulong)StaticModules.Count;
    if (uVar4 <= uVar3) break;
    bVar2 = IsGood(StaticModules.Array[uVar3]);
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return uVar4 <= uVar3;
}

Assistant:

bool FBehavior::StaticCheckAllGood ()
{
	for (unsigned int i = 0; i < StaticModules.Size(); ++i)
	{
		if (!StaticModules[i]->IsGood())
		{
			return false;
		}
	}
	return true;
}